

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O2

void JHThread::Thread::Destroy(void)

{
  mInited = false;
  Mutex::Destroy();
  TimerManager::destroyManager();
  return;
}

Assistant:

void Thread::Destroy()
{
	TRACE_BEGIN( LOG_LVL_NOTICE );
	
	mInited = false;
	
	//delete Thread::GetCurrent();
	Mutex::Destroy();
	TimerManager::destroyManager();
	
#ifdef GCHEAP_ENABLED
	GCHeap::defaultHeap->~GCHeap();
	GCHeap::defaultHeap = NULL;
#endif
}